

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateField
               (FieldDescriptor *field,Printer *printer,bool is_descriptor)

{
  byte bVar1;
  bool bVar2;
  OneofDescriptor *pOVar3;
  byte in_DL;
  Printer *in_RSI;
  FieldDescriptor *in_RDI;
  Printer *unaff_retaddr;
  int in_stack_00000060;
  undefined3 in_stack_00000064;
  string local_38 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  char (*in_stack_ffffffffffffffe0) [8];
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4a4e70);
  if (bVar2) {
    GenerateFieldDocComment
              ((Printer *)field,(FieldDescriptor *)printer,_in_stack_00000064,in_stack_00000060);
    FieldDescriptor::name_abi_cxx11_(in_RDI);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_RSI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
               (char (*) [5])in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    pOVar3 = FieldDescriptor::containing_oneof(in_RDI);
    if (pOVar3 != (OneofDescriptor *)0x0) {
      return;
    }
    GenerateFieldDocComment
              ((Printer *)field,(FieldDescriptor *)printer,_in_stack_00000064,in_stack_00000060);
    FieldDescriptor::name_abi_cxx11_(in_RDI);
    DefaultForField_abi_cxx11_((FieldDescriptor *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
    io::Printer::Print<char[5],std::__cxx11::string,char[8],std::__cxx11::string>
              (unaff_retaddr,(char *)in_RDI,&in_RSI->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string(local_38);
  }
  if ((bVar1 & 1) != 0) {
    FieldDescriptor::name_abi_cxx11_(in_RDI);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_RSI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
               (char (*) [5])in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void GenerateField(const FieldDescriptor* field, io::Printer* printer,
                   bool is_descriptor) {
  if (field->is_repeated()) {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldProperty);
    printer->Print(
        "private $^name^;\n",
        "name", field->name());
  } else if (field->containing_oneof()) {
    // Oneof fields are handled by GenerateOneofField.
    return;
  } else {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldProperty);
    printer->Print(
        "private $^name^ = ^default^;\n",
        "name", field->name(),
        "default", DefaultForField(field));
  }

  if (is_descriptor) {
    printer->Print(
        "private $has_^name^ = false;\n",
        "name", field->name());
  }
}